

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.h
# Opt level: O0

shared_ptr<mocker::ir::IntLiteral>
mocker::ir::detail::dyc_impl<mocker::ir::IntLiteral,std::shared_ptr<mocker::ir::Addr>const&>
          (shared_ptr<mocker::ir::Addr> *v,IntLiteral *param_2)

{
  shared_ptr<mocker::ir::IntLiteral> sVar1;
  IntLiteral *param_1_local;
  shared_ptr<mocker::ir::Addr> *v_local;
  
  sVar1 = std::dynamic_pointer_cast<mocker::ir::IntLiteral,mocker::ir::Addr>(v);
  sVar1.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)v;
  return (shared_ptr<mocker::ir::IntLiteral>)
         sVar1.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> dyc_impl(V &&v, T *) {
  return std::dynamic_pointer_cast<T>(v);
}